

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O2

int duckdb_brotli::BrotliTransformDictionaryWord
              (uint8_t *dst,uint8_t *word,int len,BrotliTransforms *transforms,int transform_idx)

{
  byte bVar1;
  byte bVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  ushort uVar5;
  uint8_t *puVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  byte *pbVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  uint8_t *puVar14;
  
  puVar6 = transforms->prefix_suffix;
  puVar14 = transforms->transforms;
  lVar9 = (long)transform_idx;
  lVar13 = lVar9 * 3;
  bVar1 = puVar14[lVar13 + 1];
  uVar5 = transforms->prefix_suffix_map[puVar14[lVar13 + 2]];
  pbVar10 = puVar6 + transforms->prefix_suffix_map[puVar14[lVar13]];
  bVar2 = *pbVar10;
  for (lVar13 = 0; (uint)bVar2 != (uint)lVar13; lVar13 = lVar13 + 1) {
    dst[lVar13] = pbVar10[lVar13 + 1];
  }
  if (bVar1 < 10) {
    len = len - (uint)bVar1;
  }
  else if ((byte)(bVar1 - 0xc) < 9) {
    word = word + (bVar1 - 0xb);
    len = len - (bVar1 - 0xb);
  }
  uVar11 = 0;
  uVar12 = 0;
  if (0 < len) {
    uVar12 = (ulong)(uint)len;
  }
  for (; uVar12 != uVar11; uVar11 = uVar11 + 1) {
    dst[lVar13] = word[uVar11];
    lVar13 = lVar13 + 1;
  }
  iVar8 = (int)lVar13;
  if (bVar1 == 0x16) {
    uVar3 = transforms->params[lVar9 * 2];
    uVar4 = transforms->params[(long)(transform_idx * 2) + 1];
    puVar14 = dst + (iVar8 - len);
    for (; 0 < len; len = len - iVar8) {
      iVar8 = Shift(puVar14,len,CONCAT11(uVar4,uVar3));
      puVar14 = puVar14 + iVar8;
    }
  }
  else if (bVar1 == 0xb) {
    puVar14 = dst + (iVar8 - len);
    for (; 0 < len; len = len - uVar7) {
      uVar7 = ToUpperCase(puVar14);
      puVar14 = puVar14 + uVar7;
    }
  }
  else if (bVar1 == 0x15) {
    Shift(dst + (iVar8 - len),len,
          CONCAT11(transforms->params[(long)(transform_idx * 2) + 1],transforms->params[lVar9 * 2]))
    ;
  }
  else if (bVar1 == 10) {
    ToUpperCase(dst + (iVar8 - len));
  }
  pbVar10 = puVar6 + uVar5;
  bVar1 = *pbVar10;
  for (lVar9 = 0; (uint)bVar1 != (uint)lVar9; lVar9 = lVar9 + 1) {
    dst[lVar13] = pbVar10[lVar9 + 1];
    lVar13 = lVar13 + 1;
  }
  return (int)lVar13;
}

Assistant:

int duckdb_brotli::BrotliTransformDictionaryWord(uint8_t* dst, const uint8_t* word, int len,
    const BrotliTransforms* transforms, int transform_idx) {
  int idx = 0;
  const uint8_t* prefix = BROTLI_TRANSFORM_PREFIX(transforms, transform_idx);
  uint8_t type = BROTLI_TRANSFORM_TYPE(transforms, transform_idx);
  const uint8_t* suffix = BROTLI_TRANSFORM_SUFFIX(transforms, transform_idx);
  {
    int prefix_len = *prefix++;
    while (prefix_len--) { dst[idx++] = *prefix++; }
  }
  {
    const int t = type;
    int i = 0;
    if (t <= BROTLI_TRANSFORM_OMIT_LAST_9) {
      len -= t;
    } else if (t >= BROTLI_TRANSFORM_OMIT_FIRST_1
        && t <= BROTLI_TRANSFORM_OMIT_FIRST_9) {
      int skip = t - (BROTLI_TRANSFORM_OMIT_FIRST_1 - 1);
      word += skip;
      len -= skip;
    }
    while (i < len) { dst[idx++] = word[i++]; }
    if (t == BROTLI_TRANSFORM_UPPERCASE_FIRST) {
      ToUpperCase(&dst[idx - len]);
    } else if (t == BROTLI_TRANSFORM_UPPERCASE_ALL) {
      uint8_t* uppercase = &dst[idx - len];
      while (len > 0) {
        int step = ToUpperCase(uppercase);
        uppercase += step;
        len -= step;
      }
    } else if (t == BROTLI_TRANSFORM_SHIFT_FIRST) {
      uint16_t param = (uint16_t)(transforms->params[transform_idx * 2]
          + (transforms->params[transform_idx * 2 + 1] << 8u));
      Shift(&dst[idx - len], len, param);
    } else if (t == BROTLI_TRANSFORM_SHIFT_ALL) {
      uint16_t param = (uint16_t)(transforms->params[transform_idx * 2]
          + (transforms->params[transform_idx * 2 + 1] << 8u));
      uint8_t* shift = &dst[idx - len];
      while (len > 0) {
        int step = Shift(shift, len, param);
        shift += step;
        len -= step;
      }
    }
  }
  {
    int suffix_len = *suffix++;
    while (suffix_len--) { dst[idx++] = *suffix++; }
    return idx;
  }
}